

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O3

IOHANDLE io_open(char *filename,int flags)

{
  uint uVar1;
  FILE *__stream;
  long in_FS_OFFSET;
  uchar buf [3];
  char local_1b;
  char local_1a;
  char local_19;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  __stream = (FILE *)io_open_impl(filename,flags);
  if (__stream != (FILE *)0x0 && (flags & 8U) != 0) {
    uVar1 = io_read((IOHANDLE)__stream,&local_1b,3);
    if ((((uVar1 != 3) || (local_1b != -0x11)) || (local_1a != -0x45)) || (local_19 != -0x41)) {
      fseek(__stream,0,0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (IOHANDLE)__stream;
  }
  __stack_chk_fail();
}

Assistant:

IOHANDLE io_open(const char *filename, int flags)
{
	IOHANDLE result = io_open_impl(filename, flags);
	unsigned char buf[3];
	if((flags & IOFLAG_SKIP_BOM) == 0 || !result)
	{
		return result;
	}
	if(io_read(result, buf, sizeof(buf)) != 3 || buf[0] != 0xef || buf[1] != 0xbb || buf[2] != 0xbf)
	{
		io_seek(result, 0, IOSEEK_START);
	}
	return result;
}